

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualMemory.cpp
# Opt level: O3

int __thiscall xmrig::VirtualMemory::init(VirtualMemory *this,EVP_PKEY_CTX *ctx)

{
  bool hugePages;
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  ICpuInfo *pIVar2;
  undefined4 extraout_var;
  NUMAMemoryPool *this_00;
  undefined4 extraout_var_00;
  
  hugePages = SUB81(ctx,0);
  if (pool == (NUMAMemoryPool *)0x0) {
    osInit(hugePages);
  }
  pIVar2 = Cpu::info();
  iVar1 = (*pIVar2->_vptr_ICpuInfo[0xb])(pIVar2);
  if (CONCAT44(extraout_var,iVar1) < 2) {
    this_00 = (NUMAMemoryPool *)operator_new(0x20);
    MemoryPool::MemoryPool((MemoryPool *)this_00,(size_t)this,hugePages,0);
    iVar1 = extraout_EAX_00;
  }
  else {
    this_00 = (NUMAMemoryPool *)operator_new(0x50);
    pIVar2 = Cpu::info();
    iVar1 = (*pIVar2->_vptr_ICpuInfo[0xb])(pIVar2);
    NUMAMemoryPool::NUMAMemoryPool
              (this_00,((ulong)((long)&this[-1].m_scratchpad + 7) / CONCAT44(extraout_var_00,iVar1)
                       + 1) * CONCAT44(extraout_var_00,iVar1),hugePages);
    iVar1 = extraout_EAX;
  }
  pool = this_00;
  return iVar1;
}

Assistant:

void xmrig::VirtualMemory::init(size_t poolSize, bool hugePages)
{
    if (!pool) {
        osInit(hugePages);
    }

#   ifdef XMRIG_FEATURE_HWLOC
    if (Cpu::info()->nodes() > 1) {
        pool = new NUMAMemoryPool(align(poolSize, Cpu::info()->nodes()), hugePages);
    } else
#   endif
    {
        pool = new MemoryPool(poolSize, hugePages);
    }
}